

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_vector.c
# Opt level: O2

exr_result_t exr_attr_float_vector_destroy(exr_context_t ctxt,exr_attr_float_vector_t *fv)

{
  exr_result_t eVar1;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = 0;
    if (fv != (exr_attr_float_vector_t *)0x0) {
      if ((fv->arr != (float *)0x0) && (0 < fv->alloc_size)) {
        (*ctxt->free_fn)(fv->arr);
      }
      fv->length = 0;
      fv->alloc_size = 0;
      fv->arr = (float *)0x0;
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_float_vector_destroy (exr_context_t ctxt, exr_attr_float_vector_t* fv)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
    if (fv)
    {
        exr_attr_float_vector_t nil = {0};
        if (fv->arr && fv->alloc_size > 0)
            ctxt->free_fn (EXR_CONST_CAST (void*, fv->arr));
        *fv = nil;
    }
    return EXR_ERR_SUCCESS;
}